

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMapBuffer.hpp
# Opt level: O1

bool __thiscall
BCL::
HashMapBuffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
::flush_queues(HashMapBuffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
               *this)

{
  HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  *this_00;
  iterator iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  byte bVar5;
  HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  *this_01;
  int success_;
  vector<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>
  failed_inserts;
  int rv;
  HME entry;
  uint local_9c;
  HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  *local_98;
  iterator iStack_90;
  HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  local_58;
  
  local_98 = (HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
              *)0x0;
  iStack_90._M_current =
       (HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
        *)0x0;
  local_88 = (HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
              *)0x0;
  local_58.key.len = 0;
  local_58.key.ptr.rank = 0;
  local_58.key.ptr.ptr = 0;
  local_58.used = 0;
  do {
    bVar2 = FastQueue<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>_>
            ::local_nonatomic_pop
                      ((this->queues).
                       super__Vector_base<BCL::FastQueue<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>_>,_std::allocator<BCL::FastQueue<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + my_rank,&local_58);
    if (!bVar2) break;
    bVar3 = HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
            ::local_nonatomic_insert(this->hashmap,&local_58);
    if (!bVar3) {
      if (iStack_90._M_current == local_88) {
        std::
        vector<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>,std::allocator<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>>>
        ::
        _M_realloc_insert<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>const&>
                  ((vector<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>,std::allocator<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>>>
                    *)&local_98,iStack_90,&local_58);
      }
      else {
        ((iStack_90._M_current)->key).len = local_58.key.len;
        (iStack_90._M_current)->val =
             (Container<int,_BCL::serialize<int,_0UL,_void>,_void>)local_58.val.val;
        (iStack_90._M_current)->used = local_58.used;
        ((iStack_90._M_current)->key).ptr.rank = local_58.key.ptr.rank;
        ((iStack_90._M_current)->key).ptr.ptr = local_58.key.ptr.ptr;
        iStack_90._M_current = iStack_90._M_current + 1;
      }
    }
  } while (bVar2);
  barrier();
  iVar1._M_current = iStack_90._M_current;
  if (local_98 == iStack_90._M_current) {
    local_9c = 0;
  }
  else {
    bVar5 = 1;
    this_01 = local_98;
    do {
      this_00 = this->hashmap;
      Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
      ::get(&local_78,&this_01->key);
      local_9c = (this_01->val).val;
      bVar2 = HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
              ::insert_atomic_impl_(this_00,&local_78,(int *)&local_9c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(int)local_78._M_dataplus._M_p) !=
          &local_78.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_78._M_dataplus._M_p._4_4_,(int)local_78._M_dataplus._M_p),
                        local_78.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) {
        bVar5 = 0;
      }
      this_01 = this_01 + 1;
    } while (bVar2 && this_01 != iVar1._M_current);
    local_9c = (uint)(~bVar5 & 1);
  }
  local_78._M_dataplus._M_p._0_4_ = reduce<int,std::plus<int>>();
  iVar4 = broadcast<int>((int *)&local_78,0);
  if (local_98 !=
      (HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
       *)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  return iVar4 == 0;
}

Assistant:

bool flush_queues() {
    std::vector <HME> failed_inserts;
    int num = 0;
    bool success;
    HME entry;
    do {
      num++;
      success = queues[BCL::rank()].local_nonatomic_pop(entry);
      if (success) {
        bool inserted = hashmap->local_nonatomic_insert(entry);
        if (!inserted) {
          failed_inserts.push_back(entry);
        }
      }
    } while (success);
    BCL::barrier();

    success = true;
    for (HME &entry : failed_inserts) {
      if (!hashmap->insert_atomic_impl_(entry.get_key(), entry.get_val())) {
        success = false;
        break;
      }
    }

    int success_ = (success) ? 0 : 1;
    success_ = BCL::allreduce(success_, std::plus <int> ());

    return (success_ == 0);
  }